

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O2

bool __thiscall cmServerBase::Serve(cmServerBase *this,string *errorMessage)

{
  uv_loop_t *loop;
  pointer puVar1;
  pointer puVar2;
  int iVar3;
  uv_thread_t uVar4;
  pointer puVar5;
  unique_ptr<cmConnection,_std::default_delete<cmConnection>_> *connection;
  shared_lock<cm::shared_mutex> lock;
  uv_thread_t blank_thread_t;
  
  blank_thread_t = 0;
  iVar3 = uv_thread_equal(&blank_thread_t,&this->ServeThreadId);
  if (iVar3 == 0) {
    __assert_fail("uv_thread_equal(&blank_thread_t, &ServeThreadId)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmServer.cxx"
                  ,0x1bb,"virtual bool cmServerBase::Serve(std::string *)");
  }
  uVar4 = uv_thread_self();
  this->ServeThreadId = uVar4;
  errorMessage->_M_string_length = 0;
  *(errorMessage->_M_dataplus)._M_p = '\0';
  loop = &this->Loop;
  ::cm::uv_async_ptr::init(&this->ShutdownSignal,(EVP_PKEY_CTX *)loop);
  ::cm::uv_signal_ptr::init(&this->SIGINTHandler,(EVP_PKEY_CTX *)loop);
  ::cm::uv_signal_ptr::init(&this->SIGHUPHandler,(EVP_PKEY_CTX *)loop);
  ::cm::uv_signal_ptr::start(&this->SIGINTHandler,on_signal,2);
  ::cm::uv_signal_ptr::start(&this->SIGHUPHandler,on_signal,1);
  (*this->_vptr_cmServerBase[7])(this);
  lock._mutex = &this->ConnectionsMutex;
  uv_rwlock_rdlock(&(lock._mutex)->_M_);
  puVar1 = (this->Connections).
           super__Vector_base<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar2 = (this->Connections).
           super__Vector_base<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    puVar5 = puVar2;
    if (puVar5 == puVar1) {
      ::cm::shared_lock<cm::shared_mutex>::~shared_lock(&lock);
      iVar3 = uv_run(loop,UV_RUN_DEFAULT);
      if (iVar3 != 0) {
        __assert_fail("false && \"Event loop stopped in unclean state.\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmServer.cxx"
                      ,0x1d8,"virtual bool cmServerBase::Serve(std::string *)");
      }
      goto LAB_00302c83;
    }
    iVar3 = (*((puVar5->_M_t).
               super___uniq_ptr_impl<cmConnection,_std::default_delete<cmConnection>_>._M_t.
               super__Tuple_impl<0UL,_cmConnection_*,_std::default_delete<cmConnection>_>.
               super__Head_base<0UL,_cmConnection_*,_false>._M_head_impl)->_vptr_cmConnection[7])();
    puVar2 = puVar5 + 1;
  } while ((char)iVar3 != '\0');
  ::cm::shared_lock<cm::shared_mutex>::~shared_lock(&lock);
LAB_00302c83:
  return puVar5 == puVar1;
}

Assistant:

bool cmServerBase::Serve(std::string* errorMessage)
{
#ifndef NDEBUG
  uv_thread_t blank_thread_t = {};
  assert(uv_thread_equal(&blank_thread_t, &ServeThreadId));
  ServeThreadId = uv_thread_self();
#endif

  errorMessage->clear();

  ShutdownSignal.init(Loop, __shutdownThread, this);

  SIGINTHandler.init(Loop, this);
  SIGHUPHandler.init(Loop, this);

  SIGINTHandler.start(&on_signal, SIGINT);
  SIGHUPHandler.start(&on_signal, SIGHUP);

  OnServeStart();

  {
    cm::shared_lock<cm::shared_mutex> lock(ConnectionsMutex);
    for (auto& connection : Connections) {
      if (!connection->OnServeStart(errorMessage)) {
        return false;
      }
    }
  }

  if (uv_run(&Loop, UV_RUN_DEFAULT) != 0) {
    // It is important we don't ever let the event loop exit with open handles
    // at best this is a memory leak, but it can also introduce race conditions
    // which can hang the program.
    assert(false && "Event loop stopped in unclean state.");

    *errorMessage = "Internal Error: Event loop stopped in unclean state.";
    return false;
  }

  return true;
}